

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
Js::IteratorToList(RecyclableObject *iterator,ScriptContext *scriptContext,ArenaAllocator *alloc)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  void *in_RAX;
  undefined4 *puVar4;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  RecyclableObject *nextFunc;
  void *local_38;
  Var nextValue;
  
  local_38 = in_RAX;
  if (iterator == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xd4,"(iterator != nullptr)","iterator != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
         new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer = (Type)0x0;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc = alloc;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_014f1568;
  this->length = 0;
  this->increment = 4;
  nextFunc = JavascriptOperators::CacheIteratorNext(iterator,scriptContext);
  bVar3 = JavascriptOperators::IteratorStepAndValue(iterator,scriptContext,nextFunc,&local_38);
  if (bVar3) {
    do {
      JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(this,0);
      iVar1 = (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
      (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer[iVar1] =
           local_38;
      (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count = iVar1 + 1;
      bVar3 = JavascriptOperators::IteratorStepAndValue(iterator,scriptContext,nextFunc,&local_38);
    } while (bVar3);
  }
  return this;
}

Assistant:

inline JsUtil::List<Var, ArenaAllocator>* IteratorToList(RecyclableObject *iterator, ScriptContext *scriptContext, ArenaAllocator *alloc)
    {
        Assert(iterator != nullptr);

        Var nextValue;
        JsUtil::List<Var, ArenaAllocator>* retList = JsUtil::List<Var, ArenaAllocator>::New(alloc);

        RecyclableObject* nextFunc = JavascriptOperators::CacheIteratorNext(iterator, scriptContext);
        while (JavascriptOperators::IteratorStepAndValue(iterator, scriptContext, nextFunc, &nextValue))
        {
            retList->Add(nextValue);
        }

        return retList;
    }